

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O3

void __thiscall
mjs::bound_function_args::bound_function_args
          (bound_function_args *this,gc_heap *h,
          vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *v;
  ulong uVar1;
  gc_vector<mjs::value_representation> *pgVar2;
  pointer pvVar3;
  long lVar4;
  gc_vector<mjs::value_representation> a;
  value_representation local_40;
  value_representation local_38;
  undefined8 uStack_30;
  
  this->heap_ = h;
  value_representation::value_representation(&this->bound_this_,(value *)&value::undefined);
  (this->bound_args_).pos_ = 0;
  v = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start;
  if (v != (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish) {
    value_representation::value_representation(&stack0xffffffffffffffc8,v);
    (this->bound_this_).repr_ = local_38.repr_;
    uVar1 = ((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    if (1 < uVar1) {
      local_40.repr_._0_4_ = (int)uVar1 + -1;
      gc_heap::
      allocate_and_construct<mjs::gc_vector<mjs::value_representation>,mjs::gc_heap&,unsigned_int&>
                ((gc_heap *)&stack0xffffffffffffffc8,(size_t)this->heap_,(gc_heap *)0x10,
                 (uint *)this->heap_);
      (this->bound_args_).pos_ = uStack_30._0_4_;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc8);
      pgVar2 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::value_representation>,_true>::dereference
                         (&this->bound_args_,this->heap_);
      local_38.repr_ = (uint64_t)pgVar2->heap_;
      uStack_30._0_4_ = (pgVar2->table_).pos_;
      uStack_30._4_4_ = *(uint32_t *)&pgVar2->field_0xc;
      pvVar3 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (((int)((ulong)((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) >> 3) *
           -0x33333333 & 0xfffffffeU) != 0) {
        uVar1 = 1;
        lVar4 = 0x28;
        do {
          value_representation::value_representation
                    (&local_40,(value *)((long)&pvVar3->type_ + lVar4));
          gc_vector<mjs::value_representation>::push_back
                    ((gc_vector<mjs::value_representation> *)&stack0xffffffffffffffc8,&local_40);
          uVar1 = uVar1 + 1;
          pvVar3 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar4 = lVar4 + 0x28;
        } while (uVar1 < (uint)((int)((ulong)((long)(args->
                                                  super__Vector_base<mjs::value,_std::allocator<mjs::value>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                             (long)pvVar3) >> 3) * -0x33333333));
      }
    }
  }
  return;
}

Assistant:

explicit bound_function_args(gc_heap& h, const std::vector<value>& args)
        : heap_{h}
        , bound_this_{value::undefined}
        , bound_args_{nullptr} {
        if (!args.empty()) {
            bound_this_ = value_representation{args[0]};
            if (args.size() > 1) {
                bound_args_ =  gc_vector<value_representation>::make(heap_, static_cast<uint32_t>(args.size() - 1));
                auto a = bound_args_.dereference(heap_);
                for (uint32_t i = 1; i < static_cast<uint32_t>(args.size()); ++i) {
                    a.push_back(value_representation{args[i]});
                }
            }
        }
    }